

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

void selftouch(char *arg)

{
  int iVar1;
  char *pcVar2;
  char kbuf [256];
  char acStack_138 [264];
  
  if ((uwep != (obj *)0x0) && (uwep->otyp == 0x10e)) {
    iVar1 = uwep->corpsenm;
    if ((((long)iVar1 == 0xc) || (iVar1 == 0xb)) &&
       ((u.uprops[8].extrinsic == 0 && (((byte)youmonst.mintrinsics & 0x80) == 0)))) {
      pcVar2 = mons_mname(mons + iVar1);
      pline("%s touch the %s corpse.",arg,pcVar2);
      pcVar2 = mons_mname(mons + uwep->corpsenm);
      pcVar2 = an(pcVar2);
      sprintf(acStack_138,"%s corpse",pcVar2);
      delayed_petrify((char *)0x0,acStack_138);
      if ((u.uprops[8].extrinsic == 0) &&
         ((((byte)youmonst.mintrinsics & 0x80) == 0 && (uarmg == (obj *)0x0)))) {
        pcVar2 = mons_mname(mons + uwep->corpsenm);
        pline("You release the %s corpse!",pcVar2);
        uwepgone();
      }
    }
  }
  if ((uswapwep != (obj *)0x0 && u.twoweap != '\0') && (uswapwep->otyp == 0x10e)) {
    iVar1 = uswapwep->corpsenm;
    if ((((long)iVar1 == 0xc) || (iVar1 == 0xb)) &&
       ((u.uprops[8].extrinsic == 0 && (((byte)youmonst.mintrinsics & 0x80) == 0)))) {
      pcVar2 = mons_mname(mons + iVar1);
      pline("%s touch the %s corpse.",arg,pcVar2);
      pcVar2 = mons_mname(mons + uswapwep->corpsenm);
      pcVar2 = an(pcVar2);
      sprintf(acStack_138,"%s corpse",pcVar2);
      delayed_petrify((char *)0x0,acStack_138);
      if ((u.uprops[8].extrinsic == 0) &&
         ((((byte)youmonst.mintrinsics & 0x80) == 0 && (uarmg == (obj *)0x0)))) {
        pcVar2 = mons_mname(mons + uwep->corpsenm);
        pline("You release the %s corpse!",pcVar2);
        uswapwepgone();
        return;
      }
    }
  }
  return;
}

Assistant:

void selftouch(const char *arg)
{
	char kbuf[BUFSZ];

	if (uwep && uwep->otyp == CORPSE && touch_petrifies(&mons[uwep->corpsenm])
			&& !Stone_resistance) {
		pline("%s touch the %s corpse.", arg,
		        mons_mname(&mons[uwep->corpsenm]));
		sprintf(kbuf, "%s corpse", an(mons_mname(&mons[uwep->corpsenm])));
		delayed_petrify(NULL, kbuf);
		if (!Stone_resistance && !uarmg) {
		    pline("You release the %s corpse!",
			  mons_mname(&mons[uwep->corpsenm]));
		    uwepgone();
		}
	}
	/* Or your secondary weapon, if wielded */
	if (u.twoweap && uswapwep && uswapwep->otyp == CORPSE &&
			touch_petrifies(&mons[uswapwep->corpsenm]) && !Stone_resistance){
		pline("%s touch the %s corpse.", arg,
		        mons_mname(&mons[uswapwep->corpsenm]));
		sprintf(kbuf, "%s corpse", an(mons_mname(&mons[uswapwep->corpsenm])));
		delayed_petrify(NULL, kbuf);
		if (!Stone_resistance && !uarmg) {
		    pline("You release the %s corpse!",
			  mons_mname(&mons[uwep->corpsenm]));
		    uswapwepgone();
		}
	}
}